

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus
setLocalOptionValue(HighsLogOptions *report_log_options,string *name,
                   vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                   HighsInt value)

{
  reference ppOVar1;
  undefined8 uVar2;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_RDX;
  OptionRecordInt *in_RDI;
  double use_value;
  HighsOptionType type;
  OptionStatus status;
  HighsInt index;
  undefined4 in_stack_ffffffffffffffa8;
  HighsInt in_stack_ffffffffffffffac;
  OptionRecordDouble *in_stack_ffffffffffffffb0;
  HighsLogOptions *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  HighsLogOptions *in_stack_ffffffffffffffc8;
  int local_28;
  OptionStatus local_4;
  
  local_4 = getOptionIndex(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                           (vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)
                           in_stack_ffffffffffffffb8,(HighsInt *)in_stack_ffffffffffffffb0);
  if (local_4 == kOk) {
    ppOVar1 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                        (in_RDX,(long)local_28);
    if ((*ppOVar1)->type == kInt) {
      std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                (in_RDX,(long)local_28);
      local_4 = setLocalOptionValue(in_stack_ffffffffffffffb8,in_RDI,in_stack_ffffffffffffffac);
    }
    else if ((*ppOVar1)->type == kDouble) {
      std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                (in_RDX,(long)local_28);
      local_4 = setLocalOptionValue(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                    (double)CONCAT44(in_stack_ffffffffffffffac,
                                                     in_stack_ffffffffffffffa8));
    }
    else {
      uVar2 = std::__cxx11::string::c_str();
      highsLogUser((HighsLogOptions *)in_RDI,kError,
                   "setLocalOptionValue: Option \"%s\" cannot be assigned an int\n",uVar2);
      local_4 = kIllegalValue;
    }
  }
  return local_4;
}

Assistant:

OptionStatus setLocalOptionValue(const HighsLogOptions& report_log_options,
                                 const std::string& name,
                                 std::vector<OptionRecord*>& option_records,
                                 const HighsInt value) {
  HighsInt index;
  //  printf("setLocalOptionValue: \"%s\" with HighsInt %" HIGHSINT_FORMAT "\n",
  //  name.c_str(), value);
  OptionStatus status =
      getOptionIndex(report_log_options, name, option_records, index);
  if (status != OptionStatus::kOk) return status;
  HighsOptionType type = option_records[index]->type;
  if (type != HighsOptionType::kInt) {
    if (type == HighsOptionType::kDouble) {
      // Interpret integer as double
      double use_value = value;
      return setLocalOptionValue(
          report_log_options, ((OptionRecordDouble*)option_records[index])[0],
          use_value);
    }
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "setLocalOptionValue: Option \"%s\" cannot be assigned an int\n",
        name.c_str());
    return OptionStatus::kIllegalValue;
  }
  return setLocalOptionValue(
      report_log_options, ((OptionRecordInt*)option_records[index])[0], value);
}